

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

int __thiscall
tetgenmesh::gettetrahedron(tetgenmesh *this,point pa,point pb,point pc,point pd,triface *searchtet)

{
  tetrahedron *pppdVar1;
  tetrahedron ppdVar2;
  int iVar3;
  tetrahedron *pppdVar4;
  tetrahedron *pppdVar5;
  int *piVar6;
  long lVar7;
  uint uVar8;
  
  iVar3 = getedge(this,pa,pb,searchtet);
  if (iVar3 != 0) {
    pppdVar5 = searchtet->tet;
    pppdVar4 = pppdVar5;
    piVar6 = &searchtet->ver;
    do {
      uVar8 = *piVar6;
      lVar7 = (long)(int)uVar8;
      if (pppdVar4[apexpivot[lVar7]] == (tetrahedron)pc) {
        searchtet->tet = pppdVar4;
        searchtet->ver = uVar8;
        goto LAB_001463e9;
      }
      pppdVar1 = pppdVar4 + facepivot1[lVar7];
      pppdVar4 = (tetrahedron *)((ulong)*pppdVar1 & 0xfffffffffffffff0);
      piVar6 = facepivot2[lVar7] + ((uint)*pppdVar1 & 0xf);
    } while (pppdVar5 != pppdVar4);
    uVar8 = searchtet->ver;
    lVar7 = (long)(int)uVar8;
    pppdVar4 = pppdVar5;
LAB_001463e9:
    if (pppdVar4[apexpivot[lVar7]] == (tetrahedron)pc) {
      if (pppdVar4[oppopivot[lVar7]] == (tetrahedron)pd) {
        return 1;
      }
      ppdVar2 = pppdVar4[uVar8 & 3];
      uVar8 = (uint)ppdVar2 & 0xf;
      searchtet->ver = uVar8;
      pppdVar5 = (tetrahedron *)((ulong)ppdVar2 & 0xfffffffffffffff0);
      searchtet->tet = pppdVar5;
      iVar3 = fsymtbl[lVar7][uVar8];
      searchtet->ver = iVar3;
      if (pppdVar5[oppopivot[iVar3]] == (tetrahedron)pd) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int tetgenmesh::gettetrahedron(point pa, point pb, point pc, point pd, 
                               triface *searchtet)
{
  triface spintet;
  int t1ver; 

  if (getedge(pa, pb, searchtet)) {
    spintet = *searchtet;
    while (1) {
      if (apex(spintet) == pc) {
        *searchtet = spintet;
        break;
      }
      fnextself(spintet);
      if (spintet.tet == searchtet->tet) break;
    }
    if (apex(*searchtet) == pc) {
      if (oppo(*searchtet) == pd) {
        return 1;
      } else {
        fsymself(*searchtet);
        if (oppo(*searchtet) == pd) {
          return 1;
        }
      }
    }
  }

  return 0;
}